

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O3

void __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::DataHashTable
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,_func_int_Name_ptr *hashfun,
          int maxsize,int hashsize,Real factor)

{
  pointer pEVar1;
  undefined1 auVar2 [16];
  states *psVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  int iVar8;
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  
  Array<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>
  ::Array(&this->m_elem,maxsize);
  this->m_hashfun = hashfun;
  this->m_memfactor = factor;
  auVar2 = _DAT_005f4040;
  pEVar1 = (this->m_elem).data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (int)((long)(this->m_elem).data.
                      super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1 >> 3) * -0x55555555;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)(uVar4 + 3 & 0xfffffffc);
    lVar6 = (ulong)(uVar4 & 0x7fffffff) - 1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    psVar3 = (states *)((long)(pEVar1 + 3) + 0x10);
    auVar7 = auVar7 ^ _DAT_005f4040;
    auVar9 = _DAT_005f4020;
    auVar10 = _DAT_005f4030;
    do {
      auVar11 = auVar10 ^ auVar2;
      iVar8 = auVar7._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar8 && auVar7._0_4_ < auVar11._0_4_ || iVar8 < auVar11._4_4_)
                & 1)) {
        psVar3[-0x12] = 0;
      }
      if ((auVar11._12_4_ != auVar7._12_4_ || auVar11._8_4_ <= auVar7._8_4_) &&
          auVar11._12_4_ <= auVar7._12_4_) {
        psVar3[-0xc] = 0;
      }
      auVar11 = auVar9 ^ auVar2;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar8 && (iVar12 != iVar8 || auVar11._0_4_ <= auVar7._0_4_)) {
        psVar3[-6] = 0;
        *psVar3 = FREE;
      }
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar6 + 4;
      lVar6 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar6 + 4;
      psVar3 = psVar3 + 0x18;
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
  }
  this->m_used = 0;
  this->primes[0] = 0x5f3;
  this->primes[1] = 0xddb;
  this->primes[2] = 0x1f4b;
  this->primes[3] = 0x452b;
  this->primes[4] = 0x9743;
  this->primes[5] = 0x14779;
  this->primes[6] = 0x2c05d;
  this->primes[7] = 0x5e369;
  this->primes[8] = 0xc88a3;
  this->primes[9] = 0x1a9621;
  this->primes[10] = 0x382a7d;
  this->primes[0xb] = 0x56e207;
  this->primes[0xc] = 0x765079;
  this->primes[0xd] = 0x964b67;
  this->primes[0xe] = 0xb6b29d;
  this->primes[0xf] = 0xd77b7d;
  this->primes[0x10] = 0x10d39b9;
  this->primes[0x11] = 0x1726399;
  this->primes[0x12] = 0x1ef30eb;
  this->primes[0x13] = 0x2faa127;
  this->primes[0x14] = 0x40b953f;
  this->primes[0x15] = 0x520af59;
  this->primes[0x16] = 0x638f225;
  this->primes[0x17] = 0x75410bf;
  this->primes[0x18] = 0x8716bfb;
  this->primes[0x19] = 0x990bf9f;
  this->primes[0x1a] = 0xab1cda1;
  this->primes[0x1b] = 0xbd4bcb5;
  this->primes[0x1c] = 0xcf90079;
  this->primes[0x1d] = 0xf455999;
  this->primes[0x1e] = 0x12c08515;
  this->primes[0x1f] = 0x16447fab;
  this->primes[0x20] = 0x19cf6cdf;
  this->primes[0x21] = 0x1d60b42f;
  this->primes[0x22] = 0x20f7b75b;
  this->primes[0x23] = 0x24939395;
  this->primes[0x24] = 0x296a882d;
  this->primes[0x25] = 0x2d10a387;
  this->primes[0x26] = 0x30ba1ff3;
  this->primes[0x27] = 0x346762db;
  this->primes[0x28] = 0x3817cd4d;
  this->primes[0x29] = 0x3a8f05c5;
  this->primes[0x2a] = 0x7fffffff;
  this->nprimes = 0x2b;
  if (hashsize < 1) {
    hashsize = autoHashSize(this);
  }
  this->m_hashsize = hashsize;
  return;
}

Assistant:

explicit DataHashTable(
      int (*hashfun)(const HashItem*),
      int maxsize  = 265,
      int hashsize = 0,
      Real factor  = 2.0)
      : m_elem(maxsize)
      , m_hashfun(hashfun)
      , m_memfactor(factor)
   {
      clear();

      primes[0] = 1523;
      primes[1] = 3547;
      primes[2] = 8011;
      primes[3] = 17707;
      primes[4] = 38723;
      primes[5] = 83833;
      primes[6] = 180317;
      primes[7] = 385897;
      primes[8] = 821411;
      primes[9] = 1742369;
      primes[10] = 3680893;
      primes[11] = 5693959;
      primes[12] = 7753849;
      primes[13] = 9849703;
      primes[14] = 11973277;
      primes[15] = 14121853;
      primes[16] = 17643961;
      primes[17] = 24273817;
      primes[18] = 32452843;
      primes[19] = 49979687;
      primes[20] = 67867967;
      primes[21] = 86028121;
      primes[22] = 104395301;
      primes[23] = 122949823;
      primes[24] = 141650939;
      primes[25] = 160481183;
      primes[26] = 179424673;
      primes[27] = 198491317;
      primes[28] = 217645177;
      primes[29] = 256203161;
      primes[30] = 314606869;
      primes[31] = 373587883;
      primes[32] = 433024223;
      primes[33] = 492876847;
      primes[34] = 553105243;
      primes[35] = 613651349;
      primes[36] = 694847533;
      primes[37] = 756065159;
      primes[38] = 817504243;
      primes[39] = 879190747;
      primes[40] = 941083981;
      primes[41] = 982451653;
      primes[42] = INT_MAX;
      nprimes = 43;

      m_hashsize = (hashsize < 1) ? autoHashSize() : hashsize;

      assert(m_memfactor > 1.0);
      assert(isConsistent());
   }